

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_concat(FuncState *fs,int *l1,int l2)

{
  int pc;
  int iVar1;
  uint uVar2;
  
  if (l2 != -1) {
    if (*l1 != -1) {
      iVar1 = *l1;
      do {
        pc = iVar1;
        uVar2 = fs->f->code[pc] >> 0xe;
        iVar1 = pc + -0x1fffe + uVar2;
        if (uVar2 == 0x1fffe) {
          iVar1 = -1;
        }
      } while (iVar1 != -1);
      fixjump(fs,pc,l2);
      return;
    }
    *l1 = l2;
  }
  return;
}

Assistant:

void luaK_concat(FuncState *fs, int *l1, int l2) {
    if (l2 == NO_JUMP) return;  /* nothing to concatenate? */
    else if (*l1 == NO_JUMP)  /* no original list? */
        *l1 = l2;  /* 'l1' points to 'l2' */
    else {
        int list = *l1;
        int next;
        while ((next = getjump(fs, list)) != NO_JUMP)  /* find last element */
            list = next;
        fixjump(fs, list, l2);  /* last element links to 'l2' */
    }
}